

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::transfer_momentum_error
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,CavsByBdryStatus *cavs,
               TagBase *tagbase,LOs *same_ents2old_ents,LOs *same_ents2new_ents,
               ConservedBools conserved_bools)

{
  uint ent_dim;
  Int ncomps_00;
  string *psVar1;
  pointer ppVar2;
  Read<int> local_270;
  Read<int> local_260;
  Read<double> local_250;
  Read<double> local_240;
  allocator local_229;
  string local_228 [32];
  Read<double> local_208;
  Read<double> local_1f8;
  Write<double> local_1e8;
  undefined1 local_1d8 [8];
  Reals new_elem_momenta;
  string local_1c0 [32];
  Read<double> local_1a0;
  Read<double> local_190;
  Write<double> local_180;
  undefined1 local_170 [8];
  Reals old_elem_momenta;
  undefined1 local_150 [8];
  Reals new_elem_velocities;
  undefined1 local_130 [8];
  Reals old_elem_velocities;
  Read<double> new_vert_velocities;
  Read<double> old_vert_velocities;
  Read<double> new_elem_densities;
  Read<double> old_elem_densities;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> density_name;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> momentum_name;
  string local_60 [8];
  string velocity_name;
  Int ncomps;
  Int dim;
  LOs *same_ents2old_ents_local;
  TagBase *tagbase_local;
  CavsByBdryStatus *cavs_local;
  Mesh *new_mesh_local;
  TransferOpts *opts_local;
  Mesh *old_mesh_local;
  
  ent_dim = Mesh::dim(old_mesh);
  ncomps_00 = TagBase::ncomps(tagbase);
  psVar1 = TagBase::name_abi_cxx11_(tagbase);
  std::__cxx11::string::string(local_60,(string *)psVar1);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&opts->velocity_momentum_map,(key_type *)local_60);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_88);
  std::__cxx11::string::string(local_80,(string *)&ppVar2->second);
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&opts->velocity_density_map,(key_type *)local_60);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_c0);
  std::__cxx11::string::string(local_b8,(string *)&ppVar2->second);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &old_elem_densities.write_.shared_alloc_.direct_ptr,(char *)local_80);
  Mesh::get_array<double>
            ((Mesh *)&new_elem_densities.write_.shared_alloc_.direct_ptr,(Int)old_mesh,
             (string *)(ulong)ent_dim);
  Mesh::get_array<double>
            ((Mesh *)&old_vert_velocities.write_.shared_alloc_.direct_ptr,(Int)new_mesh,
             (string *)(ulong)ent_dim);
  Mesh::get_array<double>
            ((Mesh *)&new_vert_velocities.write_.shared_alloc_.direct_ptr,(Int)old_mesh,
             (string *)0x0);
  Mesh::get_array<double>
            ((Mesh *)&old_elem_velocities.write_.shared_alloc_.direct_ptr,(Int)new_mesh,
             (string *)0x0);
  Read<double>::Read((Read<double> *)&new_elem_velocities.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&new_vert_velocities.write_.shared_alloc_.direct_ptr);
  average_field((Omega_h *)local_130,old_mesh,ent_dim,ncomps_00,
                (Reals *)&new_elem_velocities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&new_elem_velocities.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&old_elem_momenta.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&old_elem_velocities.write_.shared_alloc_.direct_ptr);
  average_field((Omega_h *)local_150,new_mesh,ent_dim,ncomps_00,
                (Reals *)&old_elem_momenta.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&old_elem_momenta.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_190,(Read<double> *)local_130);
  Read<double>::Read(&local_1a0,(Read<double> *)&new_elem_densities.write_.shared_alloc_.direct_ptr)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,"",(allocator *)((long)&new_elem_momenta.write_.shared_alloc_.direct_ptr + 7)
            );
  multiply_each<double>((Omega_h *)&local_180,&local_190,&local_1a0,(string *)local_1c0);
  Read<double>::Read((Read<double> *)local_170,&local_180);
  Write<double>::~Write(&local_180);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&new_elem_momenta.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::~Read(&local_1a0);
  Read<double>::~Read(&local_190);
  Read<double>::Read(&local_1f8,(Read<double> *)local_150);
  Read<double>::Read(&local_208,(Read<double> *)&old_vert_velocities.write_.shared_alloc_.direct_ptr
                    );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"",&local_229);
  multiply_each<double>((Omega_h *)&local_1e8,&local_1f8,&local_208,(string *)local_228);
  Read<double>::Read((Read<double> *)local_1d8,&local_1e8);
  Write<double>::~Write(&local_1e8);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  Read<double>::~Read(&local_208);
  Read<double>::~Read(&local_1f8);
  Read<double>::Read(&local_240,(Read<double> *)local_170);
  Read<double>::Read(&local_250,(Read<double> *)local_1d8);
  Read<int>::Read(&local_260,same_ents2old_ents);
  Read<int>::Read(&local_270,same_ents2new_ents);
  transfer_integ_error
            (old_mesh,new_mesh,cavs,&local_240,&local_250,
             (string *)&old_elem_densities.write_.shared_alloc_.direct_ptr,&local_260,&local_270,
             conserved_bools);
  Read<int>::~Read(&local_270);
  Read<int>::~Read(&local_260);
  Read<double>::~Read(&local_250);
  Read<double>::~Read(&local_240);
  Read<double>::~Read((Read<double> *)local_1d8);
  Read<double>::~Read((Read<double> *)local_170);
  Read<double>::~Read((Read<double> *)local_150);
  Read<double>::~Read((Read<double> *)local_130);
  Read<double>::~Read((Read<double> *)&old_elem_velocities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&new_vert_velocities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&old_vert_velocities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&new_elem_densities.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)&old_elem_densities.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

static void transfer_momentum_error(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, CavsByBdryStatus const& cavs, TagBase const* tagbase,
    LOs same_ents2old_ents, LOs same_ents2new_ents,
    ConservedBools conserved_bools) {
  auto dim = old_mesh->dim();
  auto ncomps = tagbase->ncomps();
  auto velocity_name = tagbase->name();
  auto momentum_name = opts.velocity_momentum_map.find(velocity_name)->second;
  auto density_name = opts.velocity_density_map.find(velocity_name)->second;
  auto error_name = momentum_name + "_error";
  auto old_elem_densities = old_mesh->get_array<Real>(dim, density_name);
  auto new_elem_densities = new_mesh->get_array<Real>(dim, density_name);
  auto old_vert_velocities = old_mesh->get_array<Real>(VERT, velocity_name);
  auto new_vert_velocities = new_mesh->get_array<Real>(VERT, velocity_name);
  auto old_elem_velocities =
      average_field(old_mesh, dim, ncomps, old_vert_velocities);
  auto new_elem_velocities =
      average_field(new_mesh, dim, ncomps, new_vert_velocities);
  Reals old_elem_momenta =
      multiply_each(old_elem_velocities, old_elem_densities);
  Reals new_elem_momenta =
      multiply_each(new_elem_velocities, new_elem_densities);
  transfer_integ_error(old_mesh, new_mesh, cavs, old_elem_momenta,
      new_elem_momenta, error_name, same_ents2old_ents, same_ents2new_ents,
      conserved_bools);
}